

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CZ<double>::CZ(CZ<double> *this,int control,int target,int controlState)

{
  uint __line;
  char *__assertion;
  int target_local;
  
  QControlledGate2<double>::QControlledGate2
            (&this->super_QControlledGate2<double>,control,controlState);
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00132a50;
  std::make_unique<qclab::qgates::PauliZ<double>,int_const&>((int *)&this->gate_);
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target) {
      if (target != control) {
        return;
      }
      __assertion = "control != target";
      __line = 0x2c;
      goto LAB_0011af9b;
    }
    __assertion = "target >= 0";
  }
  __line = 0x2b;
LAB_0011af9b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/qgates/CZ.hpp"
                ,__line,
                "qclab::qgates::CZ<double>::CZ(const int, const int, const int) [T = double]");
}

Assistant:

CZ( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliZ< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }